

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image,unsigned_long maxval)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  size_t __n;
  long lVar6;
  
  if ((long)*(int *)(this + 4) < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,0x100,1);
    sVar1 = image->n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memset(image->pixel,0,__n);
    if (0 < *(int *)this) {
      lVar4 = 0;
      do {
        uVar5 = 0xff - (int)((ulong)(*(long *)(*(long *)(this + 0x10) + lVar4 * 8) * 0xff) / maxval)
        ;
        if (-1 < (int)uVar5) {
          uVar3 = (ulong)uVar5;
          do {
            (*image->img)[uVar3][lVar4] = 0xff;
            bVar2 = 0 < (long)uVar3;
            uVar3 = uVar3 - 1;
          } while (bVar2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < *(int *)this);
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,(long)*(int *)(this + 4),1);
    if (0 < *(int *)(this + 4)) {
      lVar4 = 0;
      do {
        if (0 < *(int *)this) {
          lVar6 = 0;
          do {
            (*image->img)[lVar4][lVar6] =
                 ~(byte)((ulong)(*(long *)(*(long *)(*(long *)(this + 0x18) + lVar4 * 8) + lVar6 * 8
                                          ) * 0xff) / maxval);
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)this);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < *(int *)(this + 4));
    }
  }
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image, unsigned long maxval) const
{
  if (h > 1)
  {
    image.setSize(w, h, 1);

    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, static_cast<unsigned char>(255-255*row[k][i]/maxval));
      }
    }
  }
  else
  {
    image.setSize(w, 256, 1);
    image.clear();

    for (int i=0; i<w; i++)
    {
      int k=255-255*val[i]/maxval;

      while (k >= 0)
      {
        image.set(i, k--, 0, 255);
      }
    }
  }
}